

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DifferentialTest.h
# Opt level: O2

bool DiffDistTest2<unsigned_long,Blob<256>>(pfHash hash,bool drawDiagram)

{
  bool bVar1;
  int keybit;
  uint bit;
  long lVar2;
  bool local_c5;
  vector<Blob<256>,_std::allocator<Blob<256>_>_> hashes;
  unsigned_long k;
  Rand r;
  Blob<256> h1;
  Blob<256> h2;
  Blob<256> local_50;
  
  Rand::reseed(&r,0xd151e);
  std::vector<Blob<256>,_std::allocator<Blob<256>_>_>::vector
            (&hashes,0x200000,(allocator_type *)&h1);
  Blob<256>::Blob(&h1);
  Blob<256>::Blob(&h2);
  local_c5 = true;
  for (bit = 0; bit != 0x40; bit = bit + 1) {
    printf("Testing bit %d\n",(ulong)bit);
    for (lVar2 = 0; lVar2 != 0x4000000; lVar2 = lVar2 + 0x20) {
      Rand::rand_p(&r,&k,8);
      (*hash)(&k,8,0,&h1);
      flipbit(&k,8,bit);
      (*hash)(&k,8,0,&h2);
      Blob<256>::operator^(&local_50,&h1,&h2);
      Blob<256>::operator=
                ((Blob<256> *)
                 ((hashes.super__Vector_base<Blob<256>,_std::allocator<Blob<256>_>_>._M_impl.
                   super__Vector_impl_data._M_start)->bytes + lVar2),&local_50);
    }
    bVar1 = TestHashList<Blob<256>>(&hashes,true,true,drawDiagram,true,true);
    local_c5 = (bool)(local_c5 & bVar1);
    putchar(10);
  }
  std::_Vector_base<Blob<256>,_std::allocator<Blob<256>_>_>::~_Vector_base
            (&hashes.super__Vector_base<Blob<256>,_std::allocator<Blob<256>_>_>);
  return local_c5;
}

Assistant:

bool DiffDistTest2 ( pfHash hash, bool drawDiagram )
{
  Rand r(857374);

  int keybits = sizeof(keytype) * 8;
  const int keycount = 256*256*32;
  keytype k;
  
  std::vector<hashtype> hashes(keycount);
  hashtype h1,h2;

  bool result = true;

  for(int keybit = 0; keybit < keybits; keybit++)
  {
    printf("Testing bit %d\n",keybit);

    for(int i = 0; i < keycount; i++)
    {
      r.rand_p(&k,sizeof(keytype));
      
      hash(&k,sizeof(keytype),0,&h1);
      flipbit(&k,sizeof(keytype),keybit);
      hash(&k,sizeof(keytype),0,&h2);

      hashes[i] = h1 ^ h2;
    }

    result &= TestHashList<hashtype>(hashes,true,true,drawDiagram);
    printf("\n");
  }

  return result;
}